

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

uint32 __thiscall
Clasp::Solver::ccMinimize
          (Solver *this,LitVec *cc,LitVec *removed,uint32 antes,CCMinRecursive *ccMin)

{
  uint32 uVar1;
  bool bVar2;
  uint32 uVar3;
  pointer pLVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  if (ccMin != (CCMinRecursive *)0x0) {
    uVar3 = incEpoch(this,(this->assign_).assign_.ebo_.size,2);
    ccMin->open = uVar3 - 2;
  }
  uVar3 = 0;
  if ((cc->ebo_).size != 1) {
    uVar10 = 1;
    uVar8 = 1;
    uVar3 = 0;
    uVar9 = 1;
    uVar7 = 0;
    do {
      pLVar4 = (cc->ebo_).buf;
      if (antes == 3) {
LAB_0016b8cd:
        uVar5 = *(uint *)((long)(this->assign_).assign_.ebo_.buf +
                         (ulong)(pLVar4[uVar8].rep_ & 0xfffffffc)) >> 4;
        bVar2 = uVar5 < uVar7;
        if (uVar7 < uVar5) {
          uVar3 = 0;
          uVar9 = uVar10;
          uVar7 = uVar5;
        }
        uVar3 = (uVar3 + 1) - (uint)bVar2;
        uVar6 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        pLVar4[uVar6].rep_ = pLVar4[uVar8].rep_;
      }
      else {
        bVar2 = ccRemovable(this,(Literal)(pLVar4[uVar8].rep_ & 0xfffffffe ^ 2),antes,ccMin);
        pLVar4 = (cc->ebo_).buf;
        if (!bVar2) goto LAB_0016b8cd;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (removed,pLVar4 + uVar8);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (cc->ebo_).size);
    pLVar4 = (cc->ebo_).buf;
    (cc->ebo_).size = uVar10;
    if (uVar9 != 1) {
      uVar1 = pLVar4[1].rep_;
      pLVar4[1].rep_ = pLVar4[uVar9].rep_;
      pLVar4[uVar9].rep_ = uVar1;
    }
  }
  return uVar3;
}

Assistant:

uint32 Solver::ccMinimize(LitVec& cc, LitVec& removed, uint32 antes, CCMinRecursive* ccMin) {
	if (ccMin) { ccMinRecurseInit(*ccMin); }
	// skip the asserting literal
	LitVec::size_type j = 1;
	uint32 assertLevel  = 0;
	uint32 assertPos    = 1;
	uint32 onAssert     = 0;
	uint32 varLevel     = 0;
	for (LitVec::size_type i = 1; i != cc.size(); ++i) {
		if (antes == SolverStrategies::no_antes || !ccRemovable(~cc[i], antes, ccMin)) {
			if ( (varLevel = level(cc[i].var())) > assertLevel ) {
				assertLevel = varLevel;
				assertPos   = static_cast<uint32>(j);
				onAssert    = 0;
			}
			onAssert += (varLevel == assertLevel);
			cc[j++] = cc[i];
		}
		else {
			removed.push_back(cc[i]);
		}
	}
	cc.erase(cc.begin()+j, cc.end());
	if (assertPos != 1) {
		std::swap(cc[1], cc[assertPos]);
	}
	return onAssert;
}